

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<64,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<256> h;
  keytype k;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  bool in_stack_000000ab;
  bool in_stack_000000ac;
  bool in_stack_000000ad;
  bool in_stack_000000ae;
  bool in_stack_000000af;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_000000b0;
  undefined3 uVar5;
  undefined4 in_stack_ffffffffffffffa0;
  byte bVar7;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffa4;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffffb0;
  Blob<64> *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Blob<64> in_stack_ffffffffffffffd0;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x40,pcVar4,(ulong)in_ESI);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x196d31);
  Blob<64>::Blob((Blob<64> *)&stack0xffffffffffffffd0);
  memset(&stack0xffffffffffffffd0,0,8);
  if ((local_d & 1) != 0) {
    Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffffa4);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xffffffffffffffd0,8,0,&stack0xffffffffffffffa4);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back
              ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (value_type *)CONCAT44(in_ESI,in_EDX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<64>,Blob<256>>
            ((pfHash)in_stack_ffffffffffffffd0.bytes,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  sVar3 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  uVar5 = (undefined3)in_stack_ffffffffffffffa0;
  bVar7 = 1;
  bVar1 = TestHashList<Blob<256>>
                    (in_stack_000000b0,in_stack_000000af,in_stack_000000ae,in_stack_000000ad,
                     in_stack_000000ac,in_stack_000000ab);
  uVar6 = CONCAT13(bVar1 & bVar7,uVar5);
  printf("\n");
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,uVar6));
  return (bool)((byte)((uint)uVar6 >> 0x18) & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}